

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O0

int PAL_vsscanf(LPCSTR Buffer,LPCSTR Format,__va_list_tag *ap)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  FILE *__stream;
  int iVar4;
  BOOL BVar5;
  DWORD DVar6;
  size_t sVar7;
  long in_FS_OFFSET;
  bool bVar8;
  uint local_50c;
  int local_508;
  undefined8 *local_500;
  undefined8 *local_4e8;
  undefined8 *local_4c8;
  undefined8 *local_4a0;
  uint local_484;
  uint typeLen;
  LPVOID voidPtr;
  int n;
  int ret;
  WCHAR *charPtr;
  int res;
  int len;
  INT Type;
  INT Prefix;
  INT Width;
  BOOL Store;
  LPCSTR Fmt;
  LPCSTR Buff;
  __va_list_tag *p_Stack_438;
  INT Length;
  __va_list_tag *ap_local;
  LPCSTR Format_local;
  LPCSTR Buffer_local;
  CHAR local_418 [8];
  CHAR TempBuff [1024];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  Buff._4_4_ = 0;
  res = -1;
  _Width = (byte *)Format;
  Fmt = Buffer;
  p_Stack_438 = ap;
  ap_local = (__va_list_tag *)Format;
  Format_local = Buffer;
  do {
    if (*_Width == 0) {
LAB_0012aafd:
      Buffer_local._4_4_ = Buff._4_4_;
LAB_0012ab09:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return Buffer_local._4_4_;
    }
    if ((*Fmt == '\0') && (Buff._4_4_ == 0)) {
      Buff._4_4_ = -1;
      goto LAB_0012aafd;
    }
    iVar4 = isspace((uint)*_Width);
    if (iVar4 == 0) {
      if ((*_Width == 0x25) &&
         (BVar5 = Internal_ScanfExtractFormatA
                            ((LPCSTR *)&Width,local_418,0x400,&Prefix,&Type,&len,&res), BVar5 != 0))
      {
        if ((len == 2) && ((res == 2 || (res == 1)))) {
          charPtr._4_4_ = 0;
          _n = (LPWSTR)0x0;
          if ((res == 1) && (Type == -1)) {
            Type = 1;
            charPtr._4_4_ = 1;
          }
          while( true ) {
            bVar8 = false;
            if (Fmt[charPtr._4_4_] != '\0') {
              iVar4 = isspace((uint)(byte)Fmt[charPtr._4_4_]);
              bVar8 = iVar4 == 0;
            }
            if ((!bVar8) || ((Type != -1 && (Type <= charPtr._4_4_)))) break;
            charPtr._4_4_ = charPtr._4_4_ + 1;
          }
          if (Prefix != 0) {
            uVar1 = p_Stack_438->gp_offset;
            if (uVar1 < 0x29) {
              local_4a0 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_438->reg_save_area);
              p_Stack_438->gp_offset = uVar1 + 8;
            }
            else {
              local_4a0 = (undefined8 *)p_Stack_438->overflow_arg_area;
              p_Stack_438->overflow_arg_area = local_4a0 + 1;
            }
            _n = (LPWSTR)*local_4a0;
            charPtr._0_4_ = MultiByteToWideChar(0,0,Fmt,charPtr._4_4_,_n,charPtr._4_4_);
            if ((int)charPtr == 0) {
              fprintf(_stderr,"] %s %s:%d","PAL_vsscanf",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
                      ,0x484);
              __stream = _stderr;
              DVar6 = GetLastError();
              fprintf(__stream,"MultiByteToWideChar failed.  Error is %d\n",(ulong)DVar6);
              Buffer_local._4_4_ = -1;
              goto LAB_0012ab09;
            }
            if (res == 2) {
              _n[(int)charPtr] = L'\0';
            }
            Buff._4_4_ = Buff._4_4_ + 1;
          }
          Fmt = Fmt + charPtr._4_4_;
        }
        else if (res == 4) {
          if (len == 1) {
            uVar1 = p_Stack_438->gp_offset;
            if (uVar1 < 0x29) {
              local_4c8 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_438->reg_save_area);
              p_Stack_438->gp_offset = uVar1 + 8;
            }
            else {
              local_4c8 = (undefined8 *)p_Stack_438->overflow_arg_area;
              p_Stack_438->overflow_arg_area = local_4c8 + 1;
            }
            *(short *)*local_4c8 = (short)Fmt - (short)Format_local;
          }
          else {
            uVar1 = p_Stack_438->gp_offset;
            if (uVar1 < 0x29) {
              local_4e8 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_438->reg_save_area);
              p_Stack_438->gp_offset = uVar1 + 8;
            }
            else {
              local_4e8 = (undefined8 *)p_Stack_438->overflow_arg_area;
              p_Stack_438->overflow_arg_area = local_4e8 + 1;
            }
            *(int *)*local_4e8 = (int)Fmt - (int)Format_local;
          }
        }
        else {
          if (Prefix == 0) {
            voidPtr._4_4_ = sscanf_s(Fmt,local_418,&voidPtr);
          }
          else {
            uVar1 = p_Stack_438->gp_offset;
            if (uVar1 < 0x29) {
              local_500 = (undefined8 *)((long)(int)uVar1 + (long)p_Stack_438->reg_save_area);
              p_Stack_438->gp_offset = uVar1 + 8;
            }
            else {
              local_500 = (undefined8 *)p_Stack_438->overflow_arg_area;
              p_Stack_438->overflow_arg_area = local_500 + 1;
            }
            uVar3 = *local_500;
            local_484 = 0;
            if ((res == 2) || (res == 6)) {
              if (Type < 1) {
                sVar7 = strlen(Format_local);
                local_508 = (int)sVar7;
              }
              else {
                local_508 = Type;
              }
              local_484 = local_508 + 1;
            }
            else if (res == 1) {
              if (Type < 1) {
                local_50c = 1;
              }
              else {
                local_50c = Type;
              }
              local_484 = local_50c;
            }
            if (local_484 == 0) {
              voidPtr._4_4_ = sscanf_s(Fmt,local_418,uVar3,&voidPtr);
            }
            else {
              voidPtr._4_4_ = sscanf_s(Fmt,local_418,uVar3,(ulong)local_484,&voidPtr);
            }
          }
          if (voidPtr._4_4_ < 1) goto LAB_0012aafd;
          Buff._4_4_ = voidPtr._4_4_ + Buff._4_4_;
          Fmt = Fmt + (int)voidPtr;
        }
      }
      else {
        if ((*_Width != *Fmt) || (res == 7)) goto LAB_0012aafd;
        _Width = _Width + 1;
        Fmt = Fmt + 1;
      }
    }
    else {
      while (iVar4 = isspace((uint)(byte)*Fmt), iVar4 != 0) {
        Fmt = Fmt + 1;
      }
      _Width = _Width + 1;
    }
  } while( true );
}

Assistant:

__attribute__((no_instrument_function))
int PAL_vsscanf(LPCSTR Buffer, LPCSTR Format, va_list ap)
{
    INT Length = 0;
    LPCSTR Buff = Buffer;
    LPCSTR Fmt = Format;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    BOOL Store;
    INT Width;
    INT Prefix;
    INT Type = -1;

    while (*Fmt)
    {
        if (!*Buff && Length == 0)
        {
            Length = EOF;
            break;
        }
        /* remove any number of blanks */
        else if (isspace((unsigned char) *Fmt))
        {
            while (isspace((unsigned char) *Buff))
            {
                ++Buff;
            }
            ++Fmt;
        }
        else if (*Fmt == '%' &&
                 Internal_ScanfExtractFormatA(&Fmt, TempBuff, sizeof(TempBuff), &Store,
                                              &Width, &Prefix, &Type))
        {
            if (Prefix == SCANF_PREFIX_LONG &&
                (Type == SCANF_TYPE_STRING || Type == SCANF_TYPE_CHAR))
            {
                int len = 0;
                int res;
                WCHAR *charPtr = 0;

                /* a single character */
                if (Type == SCANF_TYPE_CHAR && Width == -1)
                {
                    len = Width = 1;
                }

                /* calculate length of string to copy */
                while (Buff[len] && !isspace((unsigned char) Buff[len]))
                {
                    if (Width != -1 && len >= Width)
                    {
                        break;
                    }
                    ++len;
                }

                if (Store)
                {
                    charPtr = va_arg(ap, WCHAR *);

                    res = MultiByteToWideChar(CP_ACP, 0, Buff, len,
                                            charPtr, len);
                    if (!res)
                    {
                        ASSERT("MultiByteToWideChar failed.  Error is %d\n",
                            GetLastError());
                        return -1;
                    }
                    if (Type == SCANF_TYPE_STRING)
                    {
                        /* end string */
                        charPtr[res] = 0;
                    }
                    ++Length;
                }
                Buff += len;
            }
            /* this places the number of bytes stored into the next arg */
            else if (Type == SCANF_TYPE_N)
            {
                if (Prefix == SCANF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = Buff - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = Buff - Buffer;
                }
            }
            /* types that sscanf can handle */
            else
            {
                int ret;
                int n;
                LPVOID voidPtr = NULL;

                if (Store)
                {
                    // sscanf_s requires that if we are trying to read "%s" or "%c" or "%[", then
                    // the size of the buffer must follow the buffer we are trying to read into.
                    voidPtr = va_arg(ap, LPVOID);
                    unsigned typeLen = 0;
                    if ((Type == SCANF_TYPE_STRING) || (Type == SCANF_TYPE_BRACKETS))
                    {
                        // Since this is not a Safe CRT API we don't really know the size of the destination
                        // buffer provided by the caller. So we have to assume that the caller has allocated
                        // enough space to hold either the width specified in the format or the entire input
                        // string plus '\0'.
                        typeLen = ((Width > 0) ? Width : strlen(Buffer)) + 1;
                    }
                    else if (Type == SCANF_TYPE_CHAR)
                    {
                        // Check whether the format string contains number of characters
                        // that should be read from the input string.
                        // Note: '\0' does not get appended in the "%c" case.
                        typeLen = (Width > 0) ? Width : 1;
                    }

                    if (typeLen > 0)
                    {
                        ret = sscanf_s(Buff, TempBuff, voidPtr, typeLen, &n);
                    }
                    else
                    {
                        ret = sscanf_s(Buff, TempBuff, voidPtr, &n);
                    }
                }
                else
                {
                    ret = sscanf_s(Buff, TempBuff, &n);
                }

#if SSCANF_CANNOT_HANDLE_MISSING_EXPONENT
                if ((ret == 0) && (Type == SCANF_TYPE_FLOAT))
                {
                    ret = SscanfFloatCheckExponent(Buff, TempBuff, voidPtr, &n);
                }
#endif // SSCANF_CANNOT_HANDLE_MISSING_EXPONENT

                if (ret > 0)
                {
                    Length += ret;
                }
                else
                {
                    /* no match, break scan */
                    break;
                }
                Buff += n;
            }
        }
        else
        {
            /* grab, but not store */
            if (*Fmt == *Buff && Type != SCANF_TYPE_SPACE)
            {
                ++Fmt;
                ++Buff;
            }
            /* doesn't match, break scan */
            else
            {
                break;
            }
        }
    }

    return Length;
}